

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_index_build(char *fn,int min_shift)

{
  htsExactFormat hVar1;
  BGZF *fp;
  int iVar2;
  int iVar3;
  htsFile *fp_00;
  bam_hdr_t *h;
  ulong uVar4;
  hts_idx_t *idx;
  bam1_t *b;
  long lVar5;
  int iVar6;
  long lVar7;
  int n_lvls;
  ulong uVar8;
  
  fp_00 = hts_open(fn,"r");
  if (fp_00 == (htsFile *)0x0) {
    iVar2 = -1;
  }
  else {
    hVar1 = (fp_00->format).format;
    iVar2 = -1;
    if (hVar1 == bam) {
      fp = (fp_00->fp).bgzf;
      h = bam_hdr_read(fp);
      if (min_shift < 1) {
        n_lvls = 5;
        iVar6 = 1;
        iVar3 = 0xe;
      }
      else {
        if ((long)h->n_targets < 1) {
          lVar7 = 0x100;
        }
        else {
          lVar7 = 0;
          uVar4 = 0;
          do {
            uVar8 = (ulong)h->target_len[lVar7];
            if (h->target_len[lVar7] < uVar4) {
              uVar8 = uVar4;
            }
            lVar7 = lVar7 + 1;
            uVar4 = uVar8;
          } while (h->n_targets != lVar7);
          lVar7 = uVar8 + 0x100;
        }
        lVar5 = (long)(1 << ((byte)min_shift & 0x1f));
        iVar6 = 0;
        n_lvls = 0;
        iVar3 = min_shift;
        if (lVar5 < lVar7) {
          iVar6 = 0;
          n_lvls = 0;
          do {
            n_lvls = n_lvls + 1;
            lVar5 = lVar5 * 8;
          } while (lVar5 < lVar7);
        }
      }
      idx = hts_idx_init(h->n_targets,iVar6,
                         (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,iVar3,n_lvls);
      bam_hdr_destroy(h);
      b = (bam1_t *)calloc(1,0x38);
      do {
        iVar3 = bam_read1(fp,b);
        if (iVar3 < 0) {
          hts_idx_finish(idx,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
          bam_destroy1(b);
          goto LAB_00138f6f;
        }
        uVar4 = *(ulong *)&(b->core).field_0x8;
        iVar3 = 0;
        if (uVar4 >> 0x30 != 0) {
          uVar8 = 0;
          iVar3 = 0;
          do {
            iVar3 = iVar3 + (*(uint *)(b->data + uVar8 * 4 + (uVar4 >> 0x18 & 0xff)) >> 4 &
                            (int)((0x3c1a7U >>
                                  ((char)*(uint *)(b->data + uVar8 * 4 + (uVar4 >> 0x18 & 0xff)) *
                                   '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
            uVar8 = uVar8 + 1;
          } while (uVar4 >> 0x30 != uVar8);
        }
        iVar6 = (b->core).pos;
        iVar3 = hts_idx_push(idx,(b->core).tid,iVar6,iVar3 + (uint)(iVar3 == 0) + iVar6,
                             (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,
                             (uint)((uVar4 >> 0x22 & 1) == 0));
      } while (-1 < iVar3);
      free(b->data);
      free(b);
      hts_idx_destroy(idx);
      idx = (hts_idx_t *)0x0;
LAB_00138f6f:
      if (idx != (hts_idx_t *)0x0) {
        hts_idx_save(idx,fn,(uint)(min_shift < 1));
        hts_idx_destroy(idx);
        iVar2 = 0;
      }
    }
    else if (hVar1 == cram) {
      iVar2 = cram_index_build((fp_00->fp).cram,fn);
    }
    hts_close(fp_00);
  }
  return iVar2;
}

Assistant:

int bam_index_build(const char *fn, int min_shift)
{
    hts_idx_t *idx;
    htsFile *fp;
    int ret = 0;

    if ((fp = hts_open(fn, "r")) == 0) return -1;
    switch (fp->format.format) {
    case cram:
        ret = cram_index_build(fp->fp.cram, fn);
        break;

    case bam:
        idx = bam_index(fp->fp.bgzf, min_shift);
        if (idx) {
            hts_idx_save(idx, fn, (min_shift > 0)? HTS_FMT_CSI : HTS_FMT_BAI);
            hts_idx_destroy(idx);
        }
        else ret = -1;
        break;

    default:
        ret = -1;
        break;
    }
    hts_close(fp);

    return ret;
}